

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QRectF * __thiscall QGraphicsPathItem::boundingRect(QGraphicsPathItem *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  QGraphicsPathItemPrivate *pQVar10;
  long *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal pw;
  QGraphicsPathItemPrivate *d;
  double local_a0;
  QRectF *this_00;
  QPainterPath local_60 [8];
  qreal local_58;
  qreal local_50;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  qreal local_30;
  qreal local_28;
  qreal local_20;
  QPen local_18 [8];
  QPen local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar10 = d_func((QGraphicsPathItem *)0x98808a);
  bVar8 = QRectF::isNull(&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect);
  if (bVar8) {
    QAbstractGraphicsShapeItem::pen((QAbstractGraphicsShapeItem *)this_00);
    iVar9 = QPen::style();
    if (iVar9 == 0) {
      local_a0 = 0.0;
    }
    else {
      QAbstractGraphicsShapeItem::pen((QAbstractGraphicsShapeItem *)this_00);
      local_a0 = (double)QPen::widthF();
      QPen::~QPen(local_18);
    }
    QPen::~QPen(local_10);
    if ((local_a0 != 0.0) || (NAN(local_a0))) {
      (**(code **)(*in_RSI + 0x20))(local_60);
      QPainterPath::controlPointRect();
      (pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.xp = local_58;
      (pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.yp = local_50;
      (pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.w = local_48;
      (pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.h = local_40;
      QPainterPath::~QPainterPath(local_60);
    }
    else {
      QPainterPath::controlPointRect();
      (pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.xp = local_38;
      (pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.yp = local_30;
      (pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.w = local_28;
      (pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.h = local_20;
    }
  }
  uVar1 = *(undefined4 *)&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.xp;
  uVar2 = *(undefined4 *)
           ((long)&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.xp + 4);
  uVar3 = *(undefined4 *)&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.yp;
  uVar4 = *(undefined4 *)
           ((long)&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.yp + 4);
  uVar5 = *(undefined4 *)
           ((long)&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.w + 4);
  uVar6 = *(undefined4 *)&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.h;
  uVar7 = *(undefined4 *)
           ((long)&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.h + 4);
  *(undefined4 *)&this_00->w =
       *(undefined4 *)&(pQVar10->super_QAbstractGraphicsShapeItemPrivate).boundingRect.w;
  *(undefined4 *)((long)&this_00->w + 4) = uVar5;
  *(undefined4 *)&this_00->h = uVar6;
  *(undefined4 *)((long)&this_00->h + 4) = uVar7;
  *(undefined4 *)&this_00->xp = uVar1;
  *(undefined4 *)((long)&this_00->xp + 4) = uVar2;
  *(undefined4 *)&this_00->yp = uVar3;
  *(undefined4 *)((long)&this_00->yp + 4) = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsPathItem::boundingRect() const
{
    Q_D(const QGraphicsPathItem);
    if (d->boundingRect.isNull()) {
        qreal pw = pen().style() == Qt::NoPen ? qreal(0) : pen().widthF();
        if (pw == 0.0)
            d->boundingRect = d->path.controlPointRect();
        else {
            d->boundingRect = shape().controlPointRect();
        }
    }
    return d->boundingRect;
}